

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined4 uVar55;
  ulong unaff_RBP;
  size_t mask;
  undefined4 uVar56;
  undefined4 uVar58;
  ulong uVar57;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong *puVar63;
  ulong *puVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  bool bVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  uint uVar74;
  uint uVar78;
  uint uVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar80;
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  NodeRef stack [564];
  undefined1 local_1328 [8];
  float fStack_1320;
  float fStack_131c;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_1288 [16];
  size_t local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = root.ptr;
  uVar55 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar69._4_4_ = uVar55;
  auVar69._0_4_ = uVar55;
  auVar69._8_4_ = uVar55;
  auVar69._12_4_ = uVar55;
  auVar69._16_4_ = uVar55;
  auVar69._20_4_ = uVar55;
  auVar69._24_4_ = uVar55;
  auVar69._28_4_ = uVar55;
  uVar55 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar70._4_4_ = uVar55;
  auVar70._0_4_ = uVar55;
  auVar70._8_4_ = uVar55;
  auVar70._12_4_ = uVar55;
  auVar70._16_4_ = uVar55;
  auVar70._20_4_ = uVar55;
  auVar70._24_4_ = uVar55;
  auVar70._28_4_ = uVar55;
  uVar55 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar71._4_4_ = uVar55;
  auVar71._0_4_ = uVar55;
  auVar71._8_4_ = uVar55;
  auVar71._12_4_ = uVar55;
  auVar71._16_4_ = uVar55;
  auVar71._20_4_ = uVar55;
  auVar71._24_4_ = uVar55;
  auVar71._28_4_ = uVar55;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar5 = (tray->tnear).field_0.i[k];
  auVar101._4_4_ = iVar5;
  auVar101._0_4_ = iVar5;
  auVar101._8_4_ = iVar5;
  auVar101._12_4_ = iVar5;
  auVar101._16_4_ = iVar5;
  auVar101._20_4_ = iVar5;
  auVar101._24_4_ = iVar5;
  auVar101._28_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar73._4_4_ = iVar5;
  auVar73._0_4_ = iVar5;
  auVar73._8_4_ = iVar5;
  auVar73._12_4_ = iVar5;
  auVar73._16_4_ = iVar5;
  auVar73._20_4_ = iVar5;
  auVar73._24_4_ = iVar5;
  auVar73._28_4_ = iVar5;
  puVar64 = local_11d0;
  do {
    puVar63 = puVar64;
    if (puVar63 == &local_11d8) break;
    puVar64 = puVar63 + -1;
    uVar67 = puVar63[-1];
    do {
      if ((uVar67 & 8) == 0) {
        auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar61),auVar69);
        auVar21._4_4_ = auVar20._4_4_ * fVar2;
        auVar21._0_4_ = auVar20._0_4_ * fVar2;
        auVar21._8_4_ = auVar20._8_4_ * fVar2;
        auVar21._12_4_ = auVar20._12_4_ * fVar2;
        auVar21._16_4_ = auVar20._16_4_ * fVar2;
        auVar21._20_4_ = auVar20._20_4_ * fVar2;
        auVar21._24_4_ = auVar20._24_4_ * fVar2;
        auVar21._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar59),auVar70);
        auVar22._4_4_ = auVar20._4_4_ * fVar3;
        auVar22._0_4_ = auVar20._0_4_ * fVar3;
        auVar22._8_4_ = auVar20._8_4_ * fVar3;
        auVar22._12_4_ = auVar20._12_4_ * fVar3;
        auVar22._16_4_ = auVar20._16_4_ * fVar3;
        auVar22._20_4_ = auVar20._20_4_ * fVar3;
        auVar22._24_4_ = auVar20._24_4_ * fVar3;
        auVar22._28_4_ = auVar20._28_4_;
        auVar20 = vmaxps_avx(auVar21,auVar22);
        auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar60),auVar71);
        auVar23._4_4_ = auVar21._4_4_ * fVar4;
        auVar23._0_4_ = auVar21._0_4_ * fVar4;
        auVar23._8_4_ = auVar21._8_4_ * fVar4;
        auVar23._12_4_ = auVar21._12_4_ * fVar4;
        auVar23._16_4_ = auVar21._16_4_ * fVar4;
        auVar23._20_4_ = auVar21._20_4_ * fVar4;
        auVar23._24_4_ = auVar21._24_4_ * fVar4;
        auVar23._28_4_ = auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar23,auVar101);
        auVar20 = vmaxps_avx(auVar20,auVar21);
        auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + (uVar61 ^ 0x20)),auVar69);
        auVar24._4_4_ = auVar21._4_4_ * fVar2;
        auVar24._0_4_ = auVar21._0_4_ * fVar2;
        auVar24._8_4_ = auVar21._8_4_ * fVar2;
        auVar24._12_4_ = auVar21._12_4_ * fVar2;
        auVar24._16_4_ = auVar21._16_4_ * fVar2;
        auVar24._20_4_ = auVar21._20_4_ * fVar2;
        auVar24._24_4_ = auVar21._24_4_ * fVar2;
        auVar24._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + (uVar59 ^ 0x20)),auVar70);
        auVar25._4_4_ = auVar21._4_4_ * fVar3;
        auVar25._0_4_ = auVar21._0_4_ * fVar3;
        auVar25._8_4_ = auVar21._8_4_ * fVar3;
        auVar25._12_4_ = auVar21._12_4_ * fVar3;
        auVar25._16_4_ = auVar21._16_4_ * fVar3;
        auVar25._20_4_ = auVar21._20_4_ * fVar3;
        auVar25._24_4_ = auVar21._24_4_ * fVar3;
        auVar25._28_4_ = auVar21._28_4_;
        auVar21 = vminps_avx(auVar24,auVar25);
        auVar22 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + (uVar60 ^ 0x20)),auVar71);
        auVar26._4_4_ = auVar22._4_4_ * fVar4;
        auVar26._0_4_ = auVar22._0_4_ * fVar4;
        auVar26._8_4_ = auVar22._8_4_ * fVar4;
        auVar26._12_4_ = auVar22._12_4_ * fVar4;
        auVar26._16_4_ = auVar22._16_4_ * fVar4;
        auVar26._20_4_ = auVar22._20_4_ * fVar4;
        auVar26._24_4_ = auVar22._24_4_ * fVar4;
        auVar26._28_4_ = auVar22._28_4_;
        auVar22 = vminps_avx(auVar26,auVar73);
        auVar21 = vminps_avx(auVar21,auVar22);
        auVar20 = vcmpps_avx(auVar20,auVar21,2);
        uVar55 = vmovmskps_avx(auVar20);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar55);
      }
      if ((uVar67 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar74 = 4;
        }
        else {
          uVar66 = uVar67 & 0xfffffffffffffff0;
          lVar65 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
            }
          }
          uVar74 = 0;
          uVar67 = *(ulong *)(uVar66 + lVar65 * 8);
          uVar62 = unaff_RBP - 1 & unaff_RBP;
          if (uVar62 != 0) {
            *puVar64 = uVar67;
            lVar65 = 0;
            if (uVar62 != 0) {
              for (; (uVar62 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
              }
            }
            uVar57 = uVar62 - 1;
            while( true ) {
              puVar64 = puVar64 + 1;
              uVar67 = *(ulong *)(uVar66 + lVar65 * 8);
              uVar57 = uVar57 & uVar62;
              if (uVar57 == 0) break;
              *puVar64 = uVar67;
              lVar65 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              uVar62 = uVar57 - 1;
            }
          }
        }
      }
      else {
        uVar74 = 6;
      }
    } while (uVar74 == 0);
    if (uVar74 == 6) {
      uVar66 = (ulong)((uint)uVar67 & 0xf) - 8;
      bVar68 = uVar66 != 0;
      if (bVar68) {
        uVar67 = uVar67 & 0xfffffffffffffff0;
        uVar55 = *(undefined4 *)(ray + k * 4);
        uVar58 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar81._4_4_ = uVar58;
        auVar81._0_4_ = uVar58;
        auVar81._8_4_ = uVar58;
        auVar81._12_4_ = uVar58;
        uVar58 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar88._4_4_ = uVar58;
        auVar88._0_4_ = uVar58;
        auVar88._8_4_ = uVar58;
        auVar88._12_4_ = uVar58;
        fVar6 = *(float *)(ray + k * 4 + 0x40);
        fVar7 = *(float *)(ray + k * 4 + 0x50);
        fVar8 = *(float *)(ray + k * 4 + 0x60);
        uVar62 = 0;
        do {
          lVar65 = uVar62 * 0xb0;
          pfVar1 = (float *)(uVar67 + 0x80 + lVar65);
          fVar31 = *pfVar1;
          fVar32 = pfVar1[1];
          fVar33 = pfVar1[2];
          fVar34 = pfVar1[3];
          pfVar1 = (float *)(uVar67 + 0x40 + lVar65);
          fVar35 = *pfVar1;
          fVar36 = pfVar1[1];
          fVar37 = pfVar1[2];
          fVar38 = pfVar1[3];
          auVar72._0_4_ = fVar35 * fVar31;
          auVar72._4_4_ = fVar36 * fVar32;
          auVar72._8_4_ = fVar37 * fVar33;
          auVar72._12_4_ = fVar38 * fVar34;
          pfVar1 = (float *)(uVar67 + 0x70 + lVar65);
          fVar39 = *pfVar1;
          fVar40 = pfVar1[1];
          fVar41 = pfVar1[2];
          fVar42 = pfVar1[3];
          pfVar1 = (float *)(uVar67 + 0x50 + lVar65);
          fVar43 = *pfVar1;
          fVar44 = pfVar1[1];
          fVar45 = pfVar1[2];
          fVar46 = pfVar1[3];
          auVar89._0_4_ = fVar39 * fVar43;
          auVar89._4_4_ = fVar40 * fVar44;
          auVar89._8_4_ = fVar41 * fVar45;
          auVar89._12_4_ = fVar42 * fVar46;
          auVar76 = vsubps_avx(auVar89,auVar72);
          pfVar1 = (float *)(uVar67 + 0x60 + lVar65);
          fVar47 = *pfVar1;
          fVar48 = pfVar1[1];
          fVar49 = pfVar1[2];
          fVar50 = pfVar1[3];
          local_1328._4_4_ = fVar48 * fVar44;
          local_1328._0_4_ = fVar47 * fVar43;
          fStack_1320 = fVar49 * fVar45;
          fStack_131c = fVar50 * fVar46;
          auVar19._4_4_ = uVar55;
          auVar19._0_4_ = uVar55;
          auVar19._8_4_ = uVar55;
          auVar19._12_4_ = uVar55;
          auVar19 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + lVar65),auVar19);
          auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x10 + lVar65),auVar81);
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + lVar65),auVar88);
          pfVar1 = (float *)(uVar67 + 0x30 + lVar65);
          fVar51 = *pfVar1;
          fVar52 = pfVar1[1];
          fVar53 = pfVar1[2];
          fVar54 = pfVar1[3];
          auVar95._0_4_ = fVar51 * fVar31;
          auVar95._4_4_ = fVar52 * fVar32;
          auVar95._8_4_ = fVar53 * fVar33;
          auVar95._12_4_ = fVar54 * fVar34;
          auVar82 = vsubps_avx(auVar95,_local_1328);
          auVar102._0_4_ = fVar51 * fVar39;
          auVar102._4_4_ = fVar52 * fVar40;
          auVar102._8_4_ = fVar53 * fVar41;
          auVar102._12_4_ = fVar54 * fVar42;
          auVar96._0_4_ = fVar47 * fVar35;
          auVar96._4_4_ = fVar48 * fVar36;
          auVar96._8_4_ = fVar49 * fVar37;
          auVar96._12_4_ = fVar50 * fVar38;
          auVar89 = vsubps_avx(auVar96,auVar102);
          fVar11 = auVar75._0_4_;
          fVar13 = auVar75._4_4_;
          fVar15 = auVar75._8_4_;
          fVar17 = auVar75._12_4_;
          local_12f8._4_4_ = fVar7 * fVar13;
          local_12f8._0_4_ = fVar7 * fVar11;
          fStack_12f0 = fVar7 * fVar15;
          fStack_12ec = fVar7 * fVar17;
          fVar12 = auVar72._0_4_;
          auVar97._0_4_ = fVar8 * fVar12;
          fVar14 = auVar72._4_4_;
          auVar97._4_4_ = fVar8 * fVar14;
          fVar16 = auVar72._8_4_;
          auVar97._8_4_ = fVar8 * fVar16;
          fVar18 = auVar72._12_4_;
          auVar97._12_4_ = fVar8 * fVar18;
          auVar72 = vsubps_avx(auVar97,_local_12f8);
          fVar87 = auVar19._0_4_;
          auVar98._0_4_ = fVar87 * fVar8;
          fVar92 = auVar19._4_4_;
          auVar98._4_4_ = fVar92 * fVar8;
          fVar93 = auVar19._8_4_;
          auVar98._8_4_ = fVar93 * fVar8;
          fVar94 = auVar19._12_4_;
          auVar98._12_4_ = fVar94 * fVar8;
          auVar75._0_4_ = fVar11 * fVar6;
          auVar75._4_4_ = fVar13 * fVar6;
          auVar75._8_4_ = fVar15 * fVar6;
          auVar75._12_4_ = fVar17 * fVar6;
          auVar19 = vsubps_avx(auVar75,auVar98);
          auVar99._0_4_ = fVar12 * fVar6;
          auVar99._4_4_ = fVar14 * fVar6;
          auVar99._8_4_ = fVar16 * fVar6;
          auVar99._12_4_ = fVar18 * fVar6;
          auVar90._0_4_ = fVar7 * fVar87;
          auVar90._4_4_ = fVar7 * fVar92;
          auVar90._8_4_ = fVar7 * fVar93;
          auVar90._12_4_ = fVar7 * fVar94;
          auVar75 = vsubps_avx(auVar90,auVar99);
          local_1328._0_4_ = auVar82._0_4_;
          local_1328._4_4_ = auVar82._4_4_;
          fStack_1320 = auVar82._8_4_;
          fStack_131c = auVar82._12_4_;
          local_12d8 = auVar76._0_4_;
          fStack_12d4 = auVar76._4_4_;
          fStack_12d0 = auVar76._8_4_;
          fStack_12cc = auVar76._12_4_;
          auVar100._0_4_ =
               fVar6 * local_12d8 + fVar7 * (float)local_1328._0_4_ + auVar89._0_4_ * fVar8;
          auVar100._4_4_ =
               fVar6 * fStack_12d4 + fVar7 * (float)local_1328._4_4_ + auVar89._4_4_ * fVar8;
          auVar100._8_4_ = fVar6 * fStack_12d0 + fVar7 * fStack_1320 + auVar89._8_4_ * fVar8;
          auVar100._12_4_ = fVar6 * fStack_12cc + fVar7 * fStack_131c + auVar89._12_4_ * fVar8;
          local_12f8._0_4_ = auVar72._0_4_;
          local_12f8._4_4_ = auVar72._4_4_;
          fStack_12f0 = auVar72._8_4_;
          fStack_12ec = auVar72._12_4_;
          auVar76._8_4_ = 0x80000000;
          auVar76._0_8_ = 0x8000000080000000;
          auVar76._12_4_ = 0x80000000;
          auVar76 = vandps_avx(auVar100,auVar76);
          uVar74 = auVar76._0_4_;
          auVar91._0_4_ =
               (float)(uVar74 ^ (uint)((float)local_12f8._0_4_ * fVar47 +
                                      auVar75._0_4_ * fVar31 + auVar19._0_4_ * fVar39));
          uVar78 = auVar76._4_4_;
          auVar91._4_4_ =
               (float)(uVar78 ^ (uint)((float)local_12f8._4_4_ * fVar48 +
                                      auVar75._4_4_ * fVar32 + auVar19._4_4_ * fVar40));
          uVar79 = auVar76._8_4_;
          auVar91._8_4_ =
               (float)(uVar79 ^ (uint)(fStack_12f0 * fVar49 +
                                      auVar75._8_4_ * fVar33 + auVar19._8_4_ * fVar41));
          uVar80 = auVar76._12_4_;
          auVar91._12_4_ =
               (float)(uVar80 ^ (uint)(fStack_12ec * fVar50 +
                                      auVar75._12_4_ * fVar34 + auVar19._12_4_ * fVar42));
          auVar82._0_4_ =
               (float)(uVar74 ^ (uint)((float)local_12f8._0_4_ * fVar51 +
                                      auVar75._0_4_ * fVar43 + auVar19._0_4_ * fVar35));
          auVar82._4_4_ =
               (float)(uVar78 ^ (uint)((float)local_12f8._4_4_ * fVar52 +
                                      auVar75._4_4_ * fVar44 + auVar19._4_4_ * fVar36));
          auVar82._8_4_ =
               (float)(uVar79 ^ (uint)(fStack_12f0 * fVar53 +
                                      auVar75._8_4_ * fVar45 + auVar19._8_4_ * fVar37));
          auVar82._12_4_ =
               (float)(uVar80 ^ (uint)(fStack_12ec * fVar54 +
                                      auVar75._12_4_ * fVar46 + auVar19._12_4_ * fVar38));
          auVar72 = ZEXT816(0) << 0x20;
          auVar76 = vcmpps_avx(auVar91,auVar72,5);
          auVar19 = vcmpps_avx(auVar82,auVar72,5);
          auVar76 = vandps_avx(auVar76,auVar19);
          auVar19 = vcmpps_avx(auVar100,auVar72,4);
          auVar76 = vandps_avx(auVar76,auVar19);
          auVar85._0_4_ = auVar91._0_4_ + auVar82._0_4_;
          auVar85._4_4_ = auVar91._4_4_ + auVar82._4_4_;
          auVar85._8_4_ = auVar91._8_4_ + auVar82._8_4_;
          auVar85._12_4_ = auVar91._12_4_ + auVar82._12_4_;
          auVar83._8_4_ = 0x7fffffff;
          auVar83._0_8_ = 0x7fffffff7fffffff;
          auVar83._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar100,auVar83);
          auVar72 = vcmpps_avx(auVar85,auVar19,2);
          auVar75 = auVar72 & auVar76;
          if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar75[0xf]) {
            uVar58 = 0;
            bVar9 = false;
          }
          else {
            auVar76 = vandps_avx(auVar76,auVar72);
            auVar77._0_4_ =
                 uVar74 ^ (uint)(local_12d8 * fVar87 +
                                (float)local_1328._0_4_ * fVar12 + auVar89._0_4_ * fVar11);
            auVar77._4_4_ =
                 uVar78 ^ (uint)(fStack_12d4 * fVar92 +
                                (float)local_1328._4_4_ * fVar14 + auVar89._4_4_ * fVar13);
            auVar77._8_4_ =
                 uVar79 ^ (uint)(fStack_12d0 * fVar93 +
                                fStack_1320 * fVar16 + auVar89._8_4_ * fVar15);
            auVar77._12_4_ =
                 uVar80 ^ (uint)(fStack_12cc * fVar94 +
                                fStack_131c * fVar18 + auVar89._12_4_ * fVar17);
            fVar11 = *(float *)(ray + k * 4 + 0x30);
            auVar86._0_4_ = auVar19._0_4_ * fVar11;
            auVar86._4_4_ = auVar19._4_4_ * fVar11;
            auVar86._8_4_ = auVar19._8_4_ * fVar11;
            auVar86._12_4_ = auVar19._12_4_ * fVar11;
            auVar72 = vcmpps_avx(auVar86,auVar77,1);
            fVar11 = *(float *)(ray + k * 4 + 0x80);
            auVar84._0_4_ = auVar19._0_4_ * fVar11;
            auVar84._4_4_ = auVar19._4_4_ * fVar11;
            auVar84._8_4_ = auVar19._8_4_ * fVar11;
            auVar84._12_4_ = auVar19._12_4_ * fVar11;
            auVar19 = vcmpps_avx(auVar77,auVar84,2);
            auVar19 = vandps_avx(auVar72,auVar19);
            auVar72 = auVar76 & auVar19;
            bVar29 = (auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar30 = (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar28 = (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar27 = auVar72[0xf] < '\0';
            bVar9 = ((bVar29 || bVar30) || bVar28) || bVar27;
            uVar58 = (undefined4)(uVar66 >> 0x20);
            if (((bVar29 || bVar30) || bVar28) || bVar27) {
              local_1288 = vandps_avx(auVar19,auVar76);
            }
          }
          if (bVar9) {
            uVar56 = vmovmskps_avx(local_1288);
            uVar57 = CONCAT44(uVar58,uVar56);
            do {
              uVar10 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              if ((*(uint *)(ray + k * 4 + 0x90) &
                  ((context->scene->geometries).items
                   [*(uint *)(lVar65 + uVar67 + 0x90 + uVar10 * 4)].ptr)->mask) != 0)
              goto LAB_00434bca;
              uVar57 = uVar57 ^ 1L << (uVar10 & 0x3f);
            } while (uVar57 != 0);
          }
          uVar62 = uVar62 + 1;
          bVar68 = uVar62 < uVar66;
        } while (uVar62 != uVar66);
      }
LAB_00434bca:
      uVar74 = 0;
      if (bVar68) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar74 = 1;
      }
    }
  } while ((uVar74 & 3) == 0);
  return puVar63 != &local_11d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }